

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

string * __thiscall
spirv_cross::Compiler::get_block_fallback_name_abi_cxx11_
          (string *__return_storage_ptr__,Compiler *this,VariableID id)

{
  pointer pcVar1;
  SPIRVariable *pSVar2;
  string *psVar3;
  SPIRType *pSVar4;
  TypedID<(spirv_cross::Types)2> *in_R9;
  ID local_24;
  
  local_24.id = id.id;
  pSVar2 = Variant::get<spirv_cross::SPIRVariable>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + id.id);
  psVar3 = ParsedIR::get_name_abi_cxx11_(&this->ir,local_24);
  if (psVar3->_M_string_length == 0) {
    pSVar4 = Variant::get<spirv_cross::SPIRType>
                       ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)&(pSVar2->super_IVariant).field_0xc);
    join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)2>&>
              (__return_storage_ptr__,(spirv_cross *)0x391ca8,
               (char (*) [2])&(pSVar4->super_IVariant).self,
               (TypedID<(spirv_cross::Types)0> *)0x391ca8,(char (*) [2])&local_24,in_R9);
  }
  else {
    psVar3 = ParsedIR::get_name_abi_cxx11_(&this->ir,local_24);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar3->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string Compiler::get_block_fallback_name(VariableID id) const
{
	auto &var = get<SPIRVariable>(id);
	if (get_name(id).empty())
		return join("_", get<SPIRType>(var.basetype).self, "_", id);
	else
		return get_name(id);
}